

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::NegativeCompileTime::~NegativeCompileTime(NegativeCompileTime *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual long Run()
	{
		if (!Compile( // imagesize return type check
				"#version 310 es" NL "precision highp float;" NL "precision highp int;" NL
				"layout(local_size_x = 1) in;" NL "layout(r32f) uniform image2D g_image;" NL
				"layout(std430) buffer OutputBuffer { vec4 g_color; };" NL "void main() {" NL
				"  if (imageSize(g_image) == ivec3(5)) g_color = vec4(0, 1, 0, 1);" NL
				"  else g_color = vec4(1, 0, 0, 1);" NL "}"))
		{
			return ERROR;
		}
		if (!Compile( // imageSize(samplertype)
				"#version 310 es" NL "precision highp float;" NL "precision highp int;" NL
				"layout(local_size_x = 1) in;" NL "layout(r32f) uniform sampler2D g_image;" NL
				"layout(std430) buffer OutputBuffer { vec4 g_color; };" NL "void main() {" NL
				"  if (imageSize(g_image) == ivec2(5)) g_color = vec4(0, 1, 0, 1);" NL
				"  else g_color = vec4(1, 0, 0, 1);" NL "}"))
		{
			return ERROR;
		}
		return NO_ERROR;
	}